

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  uint uVar2;
  BVH *bvh;
  NodeRef root;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  size_t k;
  ulong uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [12];
  vbool<4> vVar24;
  uint uVar25;
  int iVar26;
  undefined4 uVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  uint uVar31;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar32;
  ulong uVar33;
  NodeRef *pNVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [64];
  float fVar108;
  float fVar112;
  float fVar113;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar114;
  undefined1 auVar115 [16];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  float fVar118;
  undefined1 auVar119 [16];
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 in_ZMM14 [64];
  undefined1 auVar120 [64];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar124;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [64];
  Precalculations pre;
  float local_1a58;
  float fStack_1a54;
  float fStack_1a50;
  vbool<4> terminated;
  undefined1 local_19d8 [16];
  RTCFilterFunctionNArguments args;
  TravRayK<4,_true> tray;
  undefined1 local_1898 [16];
  undefined1 local_1888 [16];
  undefined1 local_1878 [16];
  undefined1 local_1868 [16];
  undefined1 local_1858 [16];
  undefined1 local_1848 [8];
  float fStack_1840;
  float fStack_183c;
  undefined1 local_1838 [8];
  float fStack_1830;
  float fStack_182c;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined1 local_1748 [16];
  undefined1 local_1738 [16];
  undefined1 local_1728 [16];
  undefined1 local_1718 [16];
  uint local_1708;
  uint uStack_1704;
  uint uStack_1700;
  uint uStack_16fc;
  uint local_16f8;
  uint uStack_16f4;
  uint uStack_16f0;
  uint uStack_16ec;
  uint uStack_16e8;
  uint uStack_16e4;
  uint uStack_16e0;
  uint uStack_16dc;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar111 [64];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar70 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar71 = vpcmpeqd_avx(auVar70,(undefined1  [16])valid_i->field_0);
    auVar56 = ZEXT816(0) << 0x40;
    auVar9 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar56,5);
    auVar76 = auVar71 & auVar9;
    if ((((auVar76 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar76 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar76 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar76[0xf] < '\0')
    {
      auVar9 = vandps_avx(auVar9,auVar71);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar109._8_4_ = 0x7fffffff;
      auVar109._0_8_ = 0x7fffffff7fffffff;
      auVar109._12_4_ = 0x7fffffff;
      auVar111 = ZEXT1664(auVar109);
      auVar71 = vandps_avx(auVar109,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar102._8_4_ = 0x219392ef;
      auVar102._0_8_ = 0x219392ef219392ef;
      auVar102._12_4_ = 0x219392ef;
      auVar76 = vcmpps_avx(auVar71,auVar102,1);
      auVar115._8_4_ = 0x3f800000;
      auVar115._0_8_ = &DAT_3f8000003f800000;
      auVar115._12_4_ = 0x3f800000;
      auVar89 = vdivps_avx(auVar115,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar71 = vandps_avx(auVar109,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar57 = vcmpps_avx(auVar71,auVar102,1);
      auVar90 = vdivps_avx(auVar115,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar71 = vandps_avx(auVar109,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar71 = vcmpps_avx(auVar71,auVar102,1);
      auVar91 = vdivps_avx(auVar115,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar103._8_4_ = 0x5d5e0b6b;
      auVar103._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar103._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar89,auVar103,auVar76);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar90,auVar103,auVar57);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar91,auVar103,auVar71);
      auVar71 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar56,1);
      auVar89._8_4_ = 0x10;
      auVar89._0_8_ = 0x1000000010;
      auVar89._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar71,auVar89);
      auVar71 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar56,5);
      auVar76._8_4_ = 0x20;
      auVar76._0_8_ = 0x2000000020;
      auVar76._12_4_ = 0x20;
      auVar90._8_4_ = 0x30;
      auVar90._0_8_ = 0x3000000030;
      auVar90._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar90,auVar76,auVar71);
      auVar71 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar56,5);
      auVar57._8_4_ = 0x40;
      auVar57._0_8_ = 0x4000000040;
      auVar57._12_4_ = 0x40;
      auVar91._8_4_ = 0x50;
      auVar91._0_8_ = 0x5000000050;
      auVar91._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar91,auVar57,auVar71);
      auVar71 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar56);
      auVar76 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar56);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar116 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar71,auVar9);
      auVar71._8_4_ = 0xff800000;
      auVar71._0_8_ = 0xff800000ff800000;
      auVar71._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar71,auVar76,auVar9);
      terminated.field_0._0_4_ = auVar9._0_4_ ^ auVar70._0_4_;
      terminated.field_0._4_4_ = auVar9._4_4_ ^ auVar70._4_4_;
      terminated.field_0._8_4_ = auVar9._8_4_ ^ auVar70._8_4_;
      terminated.field_0._12_4_ = auVar9._12_4_ ^ auVar70._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar31 = 3;
      }
      else {
        uVar31 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar34 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar32 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar107 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      auVar117 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      auVar70 = vpcmpeqd_avx(in_ZMM14._0_16_,in_ZMM14._0_16_);
      auVar120 = ZEXT1664(auVar70);
LAB_005398d0:
      paVar32 = paVar32 + -1;
      root.ptr = pNVar34[-1].ptr;
      pNVar34 = pNVar34 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_0053a369;
      aVar124 = *paVar32;
      auVar70 = vcmpps_avx((undefined1  [16])aVar124,(undefined1  [16])tray.tfar.field_0,1);
      uVar25 = vmovmskps_avx(auVar70);
      if (uVar25 == 0) {
LAB_0053a37a:
        iVar26 = 2;
      }
      else {
        uVar33 = (ulong)(uVar25 & 0xff);
        uVar25 = POPCOUNT(uVar25 & 0xff);
        iVar26 = 0;
        if (uVar25 <= uVar31) {
          do {
            k = 0;
            for (uVar28 = uVar33; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
              k = k + 1;
            }
            auVar120 = ZEXT1664(auVar120._0_16_);
            bVar35 = occluded1(This,bvh,root,k,&pre,ray,&tray,context);
            if (bVar35) {
              terminated.field_0.i[k] = -1;
            }
            uVar33 = uVar33 - 1 & uVar33;
          } while (uVar33 != 0);
          auVar70 = vpcmpeqd_avx(auVar120._0_16_,auVar120._0_16_);
          auVar120 = ZEXT1664(auVar70);
          auVar70 = auVar70 & ~(undefined1  [16])terminated.field_0;
          iVar26 = 3;
          auVar111 = ZEXT1664(auVar111._0_16_);
          auVar116 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar107 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar117 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          if ((((auVar70 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar70 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar70 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar70[0xf] < '\0') {
            auVar70._8_4_ = 0xff800000;
            auVar70._0_8_ = 0xff800000ff800000;
            auVar70._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar70,
                               (undefined1  [16])terminated.field_0);
            iVar26 = 2;
          }
        }
        vVar24.field_0 = terminated.field_0;
        if (uVar31 < uVar25) {
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0053a369;
              auVar70 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar124,6);
              if ((((auVar70 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar70 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar70 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar70[0xf]) goto LAB_0053a37a;
              uVar33 = (ulong)((uint)root.ptr & 0xf);
              if (uVar33 == 8) goto LAB_0053a333;
              lVar30 = (root.ptr & 0xfffffffffffffff0) + 0xa0;
              uVar28 = 0;
              auVar71 = auVar111._0_16_;
              auVar70 = auVar120._0_16_ ^ (undefined1  [16])terminated.field_0;
              goto LAB_00539b17;
            }
            auVar127 = ZEXT1664(auVar116._0_16_);
            uVar33 = 0;
            uVar28 = 8;
            do {
              uVar29 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar33 * 8);
              if (uVar29 != 8) {
                uVar27 = *(undefined4 *)(root.ptr + 0x20 + uVar33 * 4);
                auVar36._4_4_ = uVar27;
                auVar36._0_4_ = uVar27;
                auVar36._8_4_ = uVar27;
                auVar36._12_4_ = uVar27;
                auVar19._8_8_ = tray.org.field_0._8_8_;
                auVar19._0_8_ = tray.org.field_0._0_8_;
                auVar20._8_8_ = tray.org.field_0._24_8_;
                auVar20._0_8_ = tray.org.field_0._16_8_;
                auVar21._8_8_ = tray.org.field_0._40_8_;
                auVar21._0_8_ = tray.org.field_0._32_8_;
                auVar70 = vsubps_avx(auVar36,auVar19);
                auVar82._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar70._0_4_;
                auVar82._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar70._4_4_;
                auVar82._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar70._8_4_;
                auVar82._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar70._12_4_;
                uVar27 = *(undefined4 *)(root.ptr + 0x40 + uVar33 * 4);
                auVar37._4_4_ = uVar27;
                auVar37._0_4_ = uVar27;
                auVar37._8_4_ = uVar27;
                auVar37._12_4_ = uVar27;
                auVar70 = vsubps_avx(auVar37,auVar20);
                auVar96._0_4_ = tray.rdir.field_0._16_4_ * auVar70._0_4_;
                auVar96._4_4_ = tray.rdir.field_0._20_4_ * auVar70._4_4_;
                auVar96._8_4_ = tray.rdir.field_0._24_4_ * auVar70._8_4_;
                auVar96._12_4_ = tray.rdir.field_0._28_4_ * auVar70._12_4_;
                uVar27 = *(undefined4 *)(root.ptr + 0x60 + uVar33 * 4);
                auVar38._4_4_ = uVar27;
                auVar38._0_4_ = uVar27;
                auVar38._8_4_ = uVar27;
                auVar38._12_4_ = uVar27;
                auVar70 = vsubps_avx(auVar38,auVar21);
                auVar104._0_4_ = tray.rdir.field_0._32_4_ * auVar70._0_4_;
                auVar104._4_4_ = tray.rdir.field_0._36_4_ * auVar70._4_4_;
                auVar104._8_4_ = tray.rdir.field_0._40_4_ * auVar70._8_4_;
                auVar104._12_4_ = tray.rdir.field_0._44_4_ * auVar70._12_4_;
                uVar27 = *(undefined4 *)(root.ptr + 0x30 + uVar33 * 4);
                auVar39._4_4_ = uVar27;
                auVar39._0_4_ = uVar27;
                auVar39._8_4_ = uVar27;
                auVar39._12_4_ = uVar27;
                auVar70 = vsubps_avx(auVar39,auVar19);
                auVar48._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar70._0_4_;
                auVar48._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar70._4_4_;
                auVar48._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar70._8_4_;
                auVar48._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar70._12_4_;
                uVar27 = *(undefined4 *)(root.ptr + 0x50 + uVar33 * 4);
                auVar40._4_4_ = uVar27;
                auVar40._0_4_ = uVar27;
                auVar40._8_4_ = uVar27;
                auVar40._12_4_ = uVar27;
                auVar70 = vsubps_avx(auVar40,auVar20);
                auVar60._0_4_ = tray.rdir.field_0._16_4_ * auVar70._0_4_;
                auVar60._4_4_ = tray.rdir.field_0._20_4_ * auVar70._4_4_;
                auVar60._8_4_ = tray.rdir.field_0._24_4_ * auVar70._8_4_;
                auVar60._12_4_ = tray.rdir.field_0._28_4_ * auVar70._12_4_;
                uVar27 = *(undefined4 *)(root.ptr + 0x70 + uVar33 * 4);
                auVar41._4_4_ = uVar27;
                auVar41._0_4_ = uVar27;
                auVar41._8_4_ = uVar27;
                auVar41._12_4_ = uVar27;
                auVar70 = vsubps_avx(auVar41,auVar21);
                auVar72._0_4_ = tray.rdir.field_0._32_4_ * auVar70._0_4_;
                auVar72._4_4_ = tray.rdir.field_0._36_4_ * auVar70._4_4_;
                auVar72._8_4_ = tray.rdir.field_0._40_4_ * auVar70._8_4_;
                auVar72._12_4_ = tray.rdir.field_0._44_4_ * auVar70._12_4_;
                auVar70 = vminps_avx(auVar82,auVar48);
                auVar71 = vminps_avx(auVar96,auVar60);
                auVar70 = vmaxps_avx(auVar70,auVar71);
                auVar71 = vminps_avx(auVar104,auVar72);
                auVar70 = vmaxps_avx(auVar70,auVar71);
                auVar42._0_4_ = auVar107._0_4_ * auVar70._0_4_;
                auVar42._4_4_ = auVar107._4_4_ * auVar70._4_4_;
                auVar42._8_4_ = auVar107._8_4_ * auVar70._8_4_;
                auVar42._12_4_ = auVar107._12_4_ * auVar70._12_4_;
                auVar70 = vmaxps_avx(auVar82,auVar48);
                auVar71 = vmaxps_avx(auVar96,auVar60);
                auVar71 = vminps_avx(auVar70,auVar71);
                auVar70 = vmaxps_avx(auVar104,auVar72);
                auVar70 = vminps_avx(auVar71,auVar70);
                auVar49._0_4_ = auVar117._0_4_ * auVar70._0_4_;
                auVar49._4_4_ = auVar117._4_4_ * auVar70._4_4_;
                auVar49._8_4_ = auVar117._8_4_ * auVar70._8_4_;
                auVar49._12_4_ = auVar117._12_4_ * auVar70._12_4_;
                auVar70 = vmaxps_avx(auVar42,(undefined1  [16])tray.tnear.field_0);
                auVar71 = vminps_avx(auVar49,(undefined1  [16])tray.tfar.field_0);
                auVar70 = vcmpps_avx(auVar70,auVar71,2);
                if ((((auVar70 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar70 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar70 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar70[0xf] < '\0') {
                  auVar70 = vblendvps_avx(auVar116._0_16_,auVar42,auVar70);
                  if (uVar28 != 8) {
                    pNVar34->ptr = uVar28;
                    pNVar34 = pNVar34 + 1;
                    *paVar32 = auVar127._0_16_;
                    paVar32 = paVar32 + 1;
                  }
                  auVar127 = ZEXT1664(auVar70);
                  uVar28 = uVar29;
                }
              }
              aVar124 = auVar127._0_16_;
            } while ((uVar29 != 8) && (bVar35 = uVar33 < 3, uVar33 = uVar33 + 1, bVar35));
            iVar26 = 0;
            if (uVar28 == 8) {
LAB_00539ab2:
              bVar35 = false;
              iVar26 = 4;
            }
            else {
              auVar70 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar124,6);
              uVar27 = vmovmskps_avx(auVar70);
              bVar35 = true;
              if ((uint)POPCOUNT(uVar27) <= uVar31) {
                pNVar34->ptr = uVar28;
                pNVar34 = pNVar34 + 1;
                *paVar32 = aVar124;
                paVar32 = paVar32 + 1;
                goto LAB_00539ab2;
              }
            }
            root.ptr = uVar28;
          } while (bVar35);
        }
      }
      goto LAB_0053a36c;
    }
  }
  return;
  while( true ) {
    uVar28 = uVar28 + 1;
    lVar30 = lVar30 + 0xb0;
    auVar70 = auVar56;
    if (uVar33 - 8 <= uVar28) break;
LAB_00539b17:
    uVar29 = 0;
    auVar76 = auVar70;
    while( true ) {
      uVar25 = *(uint *)(lVar30 + -0x10 + uVar29 * 4);
      if ((ulong)uVar25 == 0xffffffff) break;
      uVar27 = *(undefined4 *)(lVar30 + -0xa0 + uVar29 * 4);
      auVar43._4_4_ = uVar27;
      auVar43._0_4_ = uVar27;
      auVar43._8_4_ = uVar27;
      auVar43._12_4_ = uVar27;
      uVar27 = *(undefined4 *)(lVar30 + -0x90 + uVar29 * 4);
      auVar50._4_4_ = uVar27;
      auVar50._0_4_ = uVar27;
      auVar50._8_4_ = uVar27;
      auVar50._12_4_ = uVar27;
      uVar27 = *(undefined4 *)(lVar30 + -0x80 + uVar29 * 4);
      auVar61._4_4_ = uVar27;
      auVar61._0_4_ = uVar27;
      auVar61._8_4_ = uVar27;
      auVar61._12_4_ = uVar27;
      uVar27 = *(undefined4 *)(lVar30 + -0x70 + uVar29 * 4);
      auVar73._4_4_ = uVar27;
      auVar73._0_4_ = uVar27;
      auVar73._8_4_ = uVar27;
      auVar73._12_4_ = uVar27;
      uVar27 = *(undefined4 *)(lVar30 + -0x60 + uVar29 * 4);
      auVar77._4_4_ = uVar27;
      auVar77._0_4_ = uVar27;
      auVar77._8_4_ = uVar27;
      auVar77._12_4_ = uVar27;
      uVar27 = *(undefined4 *)(lVar30 + -0x50 + uVar29 * 4);
      auVar83._4_4_ = uVar27;
      auVar83._0_4_ = uVar27;
      auVar83._8_4_ = uVar27;
      auVar83._12_4_ = uVar27;
      uVar27 = *(undefined4 *)(lVar30 + -0x40 + uVar29 * 4);
      auVar92._4_4_ = uVar27;
      auVar92._0_4_ = uVar27;
      auVar92._8_4_ = uVar27;
      auVar92._12_4_ = uVar27;
      uVar27 = *(undefined4 *)(lVar30 + -0x30 + uVar29 * 4);
      auVar119._4_4_ = uVar27;
      auVar119._0_4_ = uVar27;
      auVar119._8_4_ = uVar27;
      auVar119._12_4_ = uVar27;
      uVar27 = *(undefined4 *)(lVar30 + -0x20 + uVar29 * 4);
      auVar99._4_4_ = uVar27;
      auVar99._0_4_ = uVar27;
      auVar99._8_4_ = uVar27;
      auVar99._12_4_ = uVar27;
      auVar56 = *(undefined1 (*) [16])ray;
      auVar57 = *(undefined1 (*) [16])(ray + 0x10);
      auVar89 = *(undefined1 (*) [16])(ray + 0x20);
      auVar91 = vsubps_avx(auVar43,auVar56);
      auVar102 = vsubps_avx(auVar50,auVar57);
      auVar90 = vsubps_avx(auVar61,auVar89);
      auVar103 = vsubps_avx(auVar73,auVar56);
      auVar109 = vsubps_avx(auVar77,auVar57);
      auVar115 = vsubps_avx(auVar83,auVar89);
      auVar43 = vsubps_avx(auVar92,auVar56);
      auVar45 = vsubps_avx(auVar119,auVar57);
      auVar89 = vsubps_avx(auVar99,auVar89);
      auVar50 = vsubps_avx(auVar43,auVar91);
      auVar61 = vsubps_avx(auVar45,auVar102);
      auVar73 = vsubps_avx(auVar89,auVar90);
      auVar56._0_4_ = auVar43._0_4_ + auVar91._0_4_;
      auVar56._4_4_ = auVar43._4_4_ + auVar91._4_4_;
      auVar56._8_4_ = auVar43._8_4_ + auVar91._8_4_;
      auVar56._12_4_ = auVar43._12_4_ + auVar91._12_4_;
      auVar93._0_4_ = auVar102._0_4_ + auVar45._0_4_;
      auVar93._4_4_ = auVar102._4_4_ + auVar45._4_4_;
      auVar93._8_4_ = auVar102._8_4_ + auVar45._8_4_;
      auVar93._12_4_ = auVar102._12_4_ + auVar45._12_4_;
      fVar5 = auVar90._0_4_;
      auVar100._0_4_ = auVar89._0_4_ + fVar5;
      fVar6 = auVar90._4_4_;
      auVar100._4_4_ = auVar89._4_4_ + fVar6;
      fVar7 = auVar90._8_4_;
      auVar100._8_4_ = auVar89._8_4_ + fVar7;
      fVar8 = auVar90._12_4_;
      auVar100._12_4_ = auVar89._12_4_ + fVar8;
      auVar110._0_4_ = auVar73._0_4_ * auVar93._0_4_;
      auVar110._4_4_ = auVar73._4_4_ * auVar93._4_4_;
      auVar110._8_4_ = auVar73._8_4_ * auVar93._8_4_;
      auVar110._12_4_ = auVar73._12_4_ * auVar93._12_4_;
      auVar77 = vfmsub231ps_fma(auVar110,auVar61,auVar100);
      auVar106._0_4_ = auVar100._0_4_ * auVar50._0_4_;
      auVar106._4_4_ = auVar100._4_4_ * auVar50._4_4_;
      auVar106._8_4_ = auVar100._8_4_ * auVar50._8_4_;
      auVar106._12_4_ = auVar100._12_4_ * auVar50._12_4_;
      auVar57 = vfmsub231ps_fma(auVar106,auVar73,auVar56);
      auVar74._0_4_ = auVar61._0_4_ * auVar56._0_4_;
      auVar74._4_4_ = auVar61._4_4_ * auVar56._4_4_;
      auVar74._8_4_ = auVar61._8_4_ * auVar56._8_4_;
      auVar74._12_4_ = auVar61._12_4_ * auVar56._12_4_;
      auVar56 = vfmsub231ps_fma(auVar74,auVar50,auVar93);
      fVar15 = *(float *)(ray + 0x60);
      fVar16 = *(float *)(ray + 100);
      fVar17 = *(float *)(ray + 0x68);
      auVar23 = *(undefined1 (*) [12])(ray + 0x60);
      fVar18 = *(float *)(ray + 0x6c);
      auVar75._0_4_ = fVar15 * auVar56._0_4_;
      auVar75._4_4_ = fVar16 * auVar56._4_4_;
      auVar75._8_4_ = fVar17 * auVar56._8_4_;
      auVar75._12_4_ = fVar18 * auVar56._12_4_;
      auVar56 = *(undefined1 (*) [16])(ray + 0x50);
      auVar74 = vfmadd231ps_fma(auVar75,auVar56,auVar57);
      auVar57 = *(undefined1 (*) [16])(ray + 0x40);
      auVar92 = vfmadd231ps_fma(auVar74,auVar57,auVar77);
      auVar74 = vsubps_avx(auVar102,auVar109);
      auVar77 = vsubps_avx(auVar90,auVar115);
      auVar94._0_4_ = auVar102._0_4_ + auVar109._0_4_;
      auVar94._4_4_ = auVar102._4_4_ + auVar109._4_4_;
      auVar94._8_4_ = auVar102._8_4_ + auVar109._8_4_;
      auVar94._12_4_ = auVar102._12_4_ + auVar109._12_4_;
      auVar125._0_4_ = fVar5 + auVar115._0_4_;
      auVar125._4_4_ = fVar6 + auVar115._4_4_;
      auVar125._8_4_ = fVar7 + auVar115._8_4_;
      auVar125._12_4_ = fVar8 + auVar115._12_4_;
      fVar118 = auVar77._0_4_;
      auVar84._0_4_ = fVar118 * auVar94._0_4_;
      fVar121 = auVar77._4_4_;
      auVar84._4_4_ = fVar121 * auVar94._4_4_;
      fVar122 = auVar77._8_4_;
      auVar84._8_4_ = fVar122 * auVar94._8_4_;
      fVar123 = auVar77._12_4_;
      auVar84._12_4_ = fVar123 * auVar94._12_4_;
      auVar83 = vfmsub231ps_fma(auVar84,auVar74,auVar125);
      auVar75 = vsubps_avx(auVar91,auVar103);
      fVar10 = auVar75._0_4_;
      auVar126._0_4_ = auVar125._0_4_ * fVar10;
      fVar11 = auVar75._4_4_;
      auVar126._4_4_ = auVar125._4_4_ * fVar11;
      fVar12 = auVar75._8_4_;
      auVar126._8_4_ = auVar125._8_4_ * fVar12;
      fVar13 = auVar75._12_4_;
      auVar126._12_4_ = auVar125._12_4_ * fVar13;
      auVar97._0_4_ = auVar103._0_4_ + auVar91._0_4_;
      auVar97._4_4_ = auVar103._4_4_ + auVar91._4_4_;
      auVar97._8_4_ = auVar103._8_4_ + auVar91._8_4_;
      auVar97._12_4_ = auVar103._12_4_ + auVar91._12_4_;
      auVar90 = vfmsub231ps_fma(auVar126,auVar77,auVar97);
      fVar108 = auVar74._0_4_;
      auVar98._0_4_ = fVar108 * auVar97._0_4_;
      fVar112 = auVar74._4_4_;
      auVar98._4_4_ = fVar112 * auVar97._4_4_;
      fVar113 = auVar74._8_4_;
      auVar98._8_4_ = fVar113 * auVar97._8_4_;
      fVar114 = auVar74._12_4_;
      auVar98._12_4_ = fVar114 * auVar97._12_4_;
      auVar84 = vfmsub231ps_fma(auVar98,auVar75,auVar94);
      auVar95._0_4_ = fVar15 * auVar84._0_4_;
      auVar95._4_4_ = fVar16 * auVar84._4_4_;
      auVar95._8_4_ = fVar17 * auVar84._8_4_;
      auVar95._12_4_ = fVar18 * auVar84._12_4_;
      auVar90 = vfmadd231ps_fma(auVar95,auVar56,auVar90);
      auVar84 = vfmadd231ps_fma(auVar90,auVar57,auVar83);
      auVar83 = vsubps_avx(auVar103,auVar43);
      auVar51._0_4_ = auVar103._0_4_ + auVar43._0_4_;
      auVar51._4_4_ = auVar103._4_4_ + auVar43._4_4_;
      auVar51._8_4_ = auVar103._8_4_ + auVar43._8_4_;
      auVar51._12_4_ = auVar103._12_4_ + auVar43._12_4_;
      auVar103 = vsubps_avx(auVar109,auVar45);
      auVar44._0_4_ = auVar109._0_4_ + auVar45._0_4_;
      auVar44._4_4_ = auVar109._4_4_ + auVar45._4_4_;
      auVar44._8_4_ = auVar109._8_4_ + auVar45._8_4_;
      auVar44._12_4_ = auVar109._12_4_ + auVar45._12_4_;
      auVar109 = vsubps_avx(auVar115,auVar89);
      auVar62._0_4_ = auVar115._0_4_ + auVar89._0_4_;
      auVar62._4_4_ = auVar115._4_4_ + auVar89._4_4_;
      auVar62._8_4_ = auVar115._8_4_ + auVar89._8_4_;
      auVar62._12_4_ = auVar115._12_4_ + auVar89._12_4_;
      auVar78._0_4_ = auVar109._0_4_ * auVar44._0_4_;
      auVar78._4_4_ = auVar109._4_4_ * auVar44._4_4_;
      auVar78._8_4_ = auVar109._8_4_ * auVar44._8_4_;
      auVar78._12_4_ = auVar109._12_4_ * auVar44._12_4_;
      auVar90 = vfmsub231ps_fma(auVar78,auVar103,auVar62);
      auVar63._0_4_ = auVar83._0_4_ * auVar62._0_4_;
      auVar63._4_4_ = auVar83._4_4_ * auVar62._4_4_;
      auVar63._8_4_ = auVar83._8_4_ * auVar62._8_4_;
      auVar63._12_4_ = auVar83._12_4_ * auVar62._12_4_;
      auVar89 = vfmsub231ps_fma(auVar63,auVar109,auVar51);
      auVar52._0_4_ = auVar103._0_4_ * auVar51._0_4_;
      auVar52._4_4_ = auVar103._4_4_ * auVar51._4_4_;
      auVar52._8_4_ = auVar103._8_4_ * auVar51._8_4_;
      auVar52._12_4_ = auVar103._12_4_ * auVar51._12_4_;
      auVar115 = vfmsub231ps_fma(auVar52,auVar83,auVar44);
      auVar45._0_4_ = fVar15 * auVar115._0_4_;
      auVar45._4_4_ = fVar16 * auVar115._4_4_;
      auVar45._8_4_ = fVar17 * auVar115._8_4_;
      auVar45._12_4_ = fVar18 * auVar115._12_4_;
      auVar89 = vfmadd231ps_fma(auVar45,auVar56,auVar89);
      auVar115 = vfmadd231ps_fma(auVar89,auVar57,auVar90);
      auVar85._0_4_ = auVar115._0_4_ + auVar92._0_4_ + auVar84._0_4_;
      auVar85._4_4_ = auVar115._4_4_ + auVar92._4_4_ + auVar84._4_4_;
      auVar85._8_4_ = auVar115._8_4_ + auVar92._8_4_ + auVar84._8_4_;
      auVar85._12_4_ = auVar115._12_4_ + auVar92._12_4_ + auVar84._12_4_;
      auVar89 = vandps_avx(auVar71,auVar85);
      auVar53._0_4_ = auVar89._0_4_ * 1.1920929e-07;
      auVar53._4_4_ = auVar89._4_4_ * 1.1920929e-07;
      auVar53._8_4_ = auVar89._8_4_ * 1.1920929e-07;
      auVar53._12_4_ = auVar89._12_4_ * 1.1920929e-07;
      auVar89 = vminps_avx(auVar92,auVar84);
      auVar89 = vminps_avx(auVar89,auVar115);
      uVar14 = CONCAT44(auVar53._4_4_,auVar53._0_4_);
      auVar79._0_8_ = uVar14 ^ 0x8000000080000000;
      auVar79._8_4_ = -auVar53._8_4_;
      auVar79._12_4_ = -auVar53._12_4_;
      auVar89 = vcmpps_avx(auVar89,auVar79,5);
      auVar90 = vmaxps_avx(auVar92,auVar84);
      auVar90 = vmaxps_avx(auVar90,auVar115);
      auVar90 = vcmpps_avx(auVar90,auVar53,2);
      auVar89 = vorps_avx(auVar89,auVar90);
      auVar90 = auVar76 & auVar89;
      auVar89 = vandps_avx(auVar89,auVar76);
      if ((((auVar90 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar90 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar90 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar90[0xf])
      {
        auVar56 = vpcmpeqd_avx(auVar77,auVar77);
      }
      else {
        auVar46._0_4_ = fVar108 * auVar73._0_4_;
        auVar46._4_4_ = fVar112 * auVar73._4_4_;
        auVar46._8_4_ = fVar113 * auVar73._8_4_;
        auVar46._12_4_ = fVar114 * auVar73._12_4_;
        auVar115 = vfmsub213ps_fma(auVar61,auVar77,auVar46);
        auVar64._0_4_ = auVar103._0_4_ * fVar118;
        auVar64._4_4_ = auVar103._4_4_ * fVar121;
        auVar64._8_4_ = auVar103._8_4_ * fVar122;
        auVar64._12_4_ = auVar103._12_4_ * fVar123;
        auVar80._0_4_ = fVar10 * auVar109._0_4_;
        auVar80._4_4_ = fVar11 * auVar109._4_4_;
        auVar80._8_4_ = fVar12 * auVar109._8_4_;
        auVar80._12_4_ = fVar13 * auVar109._12_4_;
        auVar43 = vfmsub213ps_fma(auVar109,auVar74,auVar64);
        auVar90 = vandps_avx(auVar71,auVar46);
        auVar109 = vandps_avx(auVar71,auVar64);
        auVar90 = vcmpps_avx(auVar90,auVar109,1);
        auVar115 = vblendvps_avx(auVar43,auVar115,auVar90);
        auVar86._0_4_ = auVar83._0_4_ * fVar108;
        auVar86._4_4_ = auVar83._4_4_ * fVar112;
        auVar86._8_4_ = auVar83._8_4_ * fVar113;
        auVar86._12_4_ = auVar83._12_4_ * fVar114;
        auVar43 = vfmsub213ps_fma(auVar83,auVar77,auVar80);
        auVar65._0_4_ = fVar118 * auVar50._0_4_;
        auVar65._4_4_ = fVar121 * auVar50._4_4_;
        auVar65._8_4_ = fVar122 * auVar50._8_4_;
        auVar65._12_4_ = fVar123 * auVar50._12_4_;
        auVar45 = vfmsub213ps_fma(auVar73,auVar75,auVar65);
        auVar90 = vandps_avx(auVar71,auVar65);
        auVar109 = vandps_avx(auVar71,auVar80);
        auVar90 = vcmpps_avx(auVar90,auVar109,1);
        auVar109 = vblendvps_avx(auVar43,auVar45,auVar90);
        auVar22._4_4_ = fVar11 * auVar61._4_4_;
        auVar22._0_4_ = fVar10 * auVar61._0_4_;
        auVar22._8_4_ = fVar12 * auVar61._8_4_;
        auVar22._12_4_ = fVar13 * auVar61._12_4_;
        auVar43 = vfmsub213ps_fma(auVar50,auVar74,auVar22);
        auVar45 = vfmsub213ps_fma(auVar103,auVar75,auVar86);
        auVar90 = vandps_avx(auVar71,auVar22);
        auVar103 = vandps_avx(auVar71,auVar86);
        auVar90 = vcmpps_avx(auVar90,auVar103,1);
        auVar90 = vblendvps_avx(auVar45,auVar43,auVar90);
        local_1a58 = auVar23._0_4_;
        fStack_1a54 = auVar23._4_4_;
        fStack_1a50 = auVar23._8_4_;
        auVar54._0_4_ = auVar90._0_4_ * local_1a58;
        auVar54._4_4_ = auVar90._4_4_ * fStack_1a54;
        auVar54._8_4_ = auVar90._8_4_ * fStack_1a50;
        auVar54._12_4_ = auVar90._12_4_ * fVar18;
        auVar56 = vfmadd213ps_fma(auVar56,auVar109,auVar54);
        auVar56 = vfmadd213ps_fma(auVar57,auVar115,auVar56);
        auVar55._0_4_ = auVar56._0_4_ + auVar56._0_4_;
        auVar55._4_4_ = auVar56._4_4_ + auVar56._4_4_;
        auVar55._8_4_ = auVar56._8_4_ + auVar56._8_4_;
        auVar55._12_4_ = auVar56._12_4_ + auVar56._12_4_;
        auVar87._0_4_ = auVar90._0_4_ * fVar5;
        auVar87._4_4_ = auVar90._4_4_ * fVar6;
        auVar87._8_4_ = auVar90._8_4_ * fVar7;
        auVar87._12_4_ = auVar90._12_4_ * fVar8;
        auVar56 = vfmadd213ps_fma(auVar102,auVar109,auVar87);
        auVar57 = vfmadd213ps_fma(auVar91,auVar115,auVar56);
        auVar56 = vrcpps_avx(auVar55);
        auVar105._8_4_ = 0x3f800000;
        auVar105._0_8_ = &DAT_3f8000003f800000;
        auVar105._12_4_ = 0x3f800000;
        auVar91 = vfnmadd213ps_fma(auVar56,auVar55,auVar105);
        auVar56 = vfmadd132ps_fma(auVar91,auVar56,auVar56);
        auVar88._0_4_ = auVar56._0_4_ * (auVar57._0_4_ + auVar57._0_4_);
        auVar88._4_4_ = auVar56._4_4_ * (auVar57._4_4_ + auVar57._4_4_);
        auVar88._8_4_ = auVar56._8_4_ * (auVar57._8_4_ + auVar57._8_4_);
        auVar88._12_4_ = auVar56._12_4_ * (auVar57._12_4_ + auVar57._12_4_);
        auVar56 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar88,2);
        auVar57 = vcmpps_avx(auVar88,*(undefined1 (*) [16])(ray + 0x80),2);
        auVar56 = vandps_avx(auVar57,auVar56);
        uVar14 = CONCAT44(auVar55._4_4_,auVar55._0_4_);
        auVar101._0_8_ = uVar14 ^ 0x8000000080000000;
        auVar101._8_4_ = -auVar55._8_4_;
        auVar101._12_4_ = -auVar55._12_4_;
        auVar57 = vcmpps_avx(auVar101,auVar55,4);
        auVar56 = vandps_avx(auVar57,auVar56);
        auVar56 = vpslld_avx(auVar56,0x1f);
        auVar57 = vpsrad_avx(auVar56,0x1f);
        auVar56 = auVar89 & auVar57;
        auVar89 = vandps_avx(auVar57,auVar89);
        if ((((auVar56 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar56 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar56 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar56[0xf] < '\0') {
          local_1898 = auVar90;
          local_1888 = auVar109;
          local_1878 = auVar115;
          local_1868 = auVar88;
          local_1858 = auVar85;
          _local_1848 = auVar84;
          _local_1838 = auVar92;
        }
        auVar56 = vpcmpeqd_avx(auVar77,auVar77);
      }
      auVar120 = ZEXT1664(auVar56);
      auVar117 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      auVar116 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      auVar107 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      pGVar3 = (context->scene->geometries).items[uVar25].ptr;
      uVar2 = pGVar3->mask;
      auVar47._4_4_ = uVar2;
      auVar47._0_4_ = uVar2;
      auVar47._8_4_ = uVar2;
      auVar47._12_4_ = uVar2;
      auVar57 = vpand_avx(auVar47,*(undefined1 (*) [16])(ray + 0x90));
      auVar57 = vpcmpeqd_avx(auVar57,_DAT_01feba10);
      auVar90 = auVar89 & ~auVar57;
      if ((((auVar90 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar90 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar90 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar90[0xf] < '\0'
         ) {
        uVar27 = *(undefined4 *)(lVar30 + uVar29 * 4);
        auVar57 = vandnps_avx(auVar57,auVar89);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar89 = vandps_avx(auVar71,local_1858);
          auVar90 = vrcpps_avx(local_1858);
          auVar81._8_4_ = 0x3f800000;
          auVar81._0_8_ = &DAT_3f8000003f800000;
          auVar81._12_4_ = 0x3f800000;
          auVar91 = vfnmadd213ps_fma(auVar90,local_1858,auVar81);
          auVar90 = vfmadd132ps_fma(auVar91,auVar90,auVar90);
          auVar66._8_4_ = 0x219392ef;
          auVar66._0_8_ = 0x219392ef219392ef;
          auVar66._12_4_ = 0x219392ef;
          auVar89 = vcmpps_avx(auVar89,auVar66,5);
          auVar89 = vandps_avx(auVar89,auVar90);
          auVar67._0_4_ = auVar89._0_4_ * (float)local_1838._0_4_;
          auVar67._4_4_ = auVar89._4_4_ * (float)local_1838._4_4_;
          auVar67._8_4_ = auVar89._8_4_ * fStack_1830;
          auVar67._12_4_ = auVar89._12_4_ * fStack_182c;
          local_1738 = vminps_avx(auVar67,auVar81);
          auVar58._0_4_ = auVar89._0_4_ * (float)local_1848._0_4_;
          auVar58._4_4_ = auVar89._4_4_ * (float)local_1848._4_4_;
          auVar58._8_4_ = auVar89._8_4_ * fStack_1840;
          auVar58._12_4_ = auVar89._12_4_ * fStack_183c;
          local_1728 = vminps_avx(auVar58,auVar81);
          local_1718._4_4_ = uVar27;
          local_1718._0_4_ = uVar27;
          local_1718._8_4_ = uVar27;
          local_1718._12_4_ = uVar27;
          local_1768 = local_1878._0_8_;
          uStack_1760 = local_1878._8_8_;
          local_1758 = local_1888._0_8_;
          uStack_1750 = local_1888._8_8_;
          local_1748 = local_1898;
          vpcmpeqd_avx2(ZEXT1632(local_1728),ZEXT1632(local_1728));
          uStack_16f4 = context->user->instID[0];
          local_16f8 = uStack_16f4;
          uStack_16f0 = uStack_16f4;
          uStack_16ec = uStack_16f4;
          uStack_16e8 = context->user->instPrimID[0];
          uStack_16e4 = uStack_16e8;
          uStack_16e0 = uStack_16e8;
          uStack_16dc = uStack_16e8;
          auVar89 = *(undefined1 (*) [16])(ray + 0x80);
          auVar90 = vblendvps_avx(auVar89,local_1868,auVar57);
          *(undefined1 (*) [16])(ray + 0x80) = auVar90;
          args.valid = (int *)local_19d8;
          args.geometryUserPtr = pGVar3->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_1768;
          args.N = 4;
          local_19d8 = auVar57;
          args.ray = (RTCRayN *)ray;
          local_1708 = uVar25;
          uStack_1704 = uVar25;
          uStack_1700 = uVar25;
          uStack_16fc = uVar25;
          if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar3->occlusionFilterN)(&args);
            auVar117 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
            auVar107 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
            auVar116 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          }
          if (local_19d8 == (undefined1  [16])0x0) {
            auVar57 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
            auVar56 = vpcmpeqd_avx(auVar56,auVar56);
            auVar120 = ZEXT1664(auVar56);
            auVar56 = auVar56 ^ auVar57;
          }
          else {
            p_Var4 = context->args->filter;
            auVar56 = vpcmpeqd_avx(auVar56,auVar56);
            auVar120 = ZEXT1664(auVar56);
            if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var4)(&args);
              auVar56 = vpcmpeqd_avx(auVar56,auVar56);
              auVar120 = ZEXT1664(auVar56);
              auVar117 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
              auVar107 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
              auVar116 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            }
            auVar57 = vpcmpeqd_avx((undefined1  [16])0x0,local_19d8);
            auVar56 = auVar120._0_16_ ^ auVar57;
            auVar68._8_4_ = 0xff800000;
            auVar68._0_8_ = 0xff800000ff800000;
            auVar68._12_4_ = 0xff800000;
            auVar57 = vblendvps_avx(auVar68,*(undefined1 (*) [16])(args.ray + 0x80),auVar57);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar57;
          }
          auVar56 = vpslld_avx(auVar56,0x1f);
          auVar57 = vpsrad_avx(auVar56,0x1f);
          auVar56 = vblendvps_avx(auVar89,*(undefined1 (*) [16])pRVar1,auVar56);
          *(undefined1 (*) [16])pRVar1 = auVar56;
        }
        auVar76 = vpandn_avx(auVar57,auVar76);
      }
      auVar111 = ZEXT1664(auVar71);
      if (((((auVar76 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar76 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar76 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar76[0xf])
         || (bVar35 = 2 < uVar29, uVar29 = uVar29 + 1, bVar35)) break;
    }
    auVar56 = vpand_avx(auVar76,auVar70);
    auVar70 = auVar70 & auVar76;
    if ((((auVar70 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar70 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar70 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar70[0xf])
    break;
  }
  terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar120._0_16_ ^ auVar56);
LAB_0053a333:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vpor_avx((undefined1  [16])vVar24.field_0,(undefined1  [16])terminated.field_0);
  auVar70 = auVar120._0_16_ & ~(undefined1  [16])terminated.field_0;
  if ((((auVar70 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar70 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar70 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar70[0xf]) {
LAB_0053a369:
    iVar26 = 3;
  }
  else {
    auVar69._8_4_ = 0xff800000;
    auVar69._0_8_ = 0xff800000ff800000;
    auVar69._12_4_ = 0xff800000;
    tray.tfar.field_0 =
         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
         vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar69,
                       (undefined1  [16])terminated.field_0);
    iVar26 = 0;
  }
LAB_0053a36c:
  if (iVar26 == 3) {
    auVar9 = vandps_avx(auVar9,(undefined1  [16])terminated.field_0);
    auVar59._8_4_ = 0xff800000;
    auVar59._0_8_ = 0xff800000ff800000;
    auVar59._12_4_ = 0xff800000;
    auVar9 = vmaskmovps_avx(auVar9,auVar59);
    *(undefined1 (*) [16])pRVar1 = auVar9;
    return;
  }
  goto LAB_005398d0;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }